

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_exts(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  uint32_t uVar8;
  ulong __n;
  char *pcVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  uint local_744;
  uint32_t i_25;
  char *d;
  long lStack_730;
  char head [5];
  ptrdiff_t rl;
  ptrdiff_t hl;
  ptrdiff_t sz;
  int8_t ext_type_25;
  char *pcStack_710;
  char *d4_24;
  char *d3_24;
  char *s2_24;
  char *pcStack_6f0;
  uint32_t len2_24;
  char *d2_24;
  char *d1_24;
  int8_t ext_type_24;
  char *pcStack_6d8;
  uint32_t i_24;
  char *s1_24;
  char *local_6c8;
  char *d4_23;
  char *d3_23;
  char *s2_23;
  char *pcStack_6a8;
  uint32_t len2_23;
  char *d2_23;
  char *d1_23;
  int8_t ext_type_23;
  char *pcStack_690;
  uint32_t i_23;
  char *s1_23;
  char *local_680;
  char *d4_22;
  char *d3_22;
  char *s2_22;
  char *pcStack_660;
  uint32_t len2_22;
  char *d2_22;
  char *d1_22;
  int8_t ext_type_22;
  char *pcStack_648;
  uint32_t i_22;
  char *s1_22;
  char *local_638;
  char *d4_21;
  char *d3_21;
  char *s2_21;
  char *pcStack_618;
  uint32_t len2_21;
  char *d2_21;
  char *d1_21;
  int8_t ext_type_21;
  char *pcStack_600;
  uint32_t i_21;
  char *s1_21;
  char *local_5f0;
  char *d4_20;
  char *d3_20;
  char *s2_20;
  char *pcStack_5d0;
  uint32_t len2_20;
  char *d2_20;
  char *d1_20;
  int8_t ext_type_20;
  char *pcStack_5b8;
  uint32_t i_20;
  char *s1_20;
  char *local_5a8;
  char *d4_19;
  char *d3_19;
  char *s2_19;
  char *pcStack_588;
  uint32_t len2_19;
  char *d2_19;
  char *d1_19;
  int8_t ext_type_19;
  char *pcStack_570;
  uint32_t i_19;
  char *s1_19;
  char *local_560;
  char *d4_18;
  char *d3_18;
  char *s2_18;
  char *pcStack_540;
  uint32_t len2_18;
  char *d2_18;
  char *d1_18;
  int8_t ext_type_18;
  char *pcStack_528;
  uint32_t i_18;
  char *s1_18;
  char *local_518;
  char *d4_17;
  char *d3_17;
  char *s2_17;
  char *pcStack_4f8;
  uint32_t len2_17;
  char *d2_17;
  char *d1_17;
  int8_t ext_type_17;
  char *pcStack_4e0;
  uint32_t i_17;
  char *s1_17;
  char *local_4d0;
  char *d4_16;
  char *d3_16;
  char *s2_16;
  char *pcStack_4b0;
  uint32_t len2_16;
  char *d2_16;
  char *d1_16;
  int8_t ext_type_16;
  char *pcStack_498;
  uint32_t i_16;
  char *s1_16;
  char *local_488;
  char *d4_15;
  char *d3_15;
  char *s2_15;
  char *pcStack_468;
  uint32_t len2_15;
  char *d2_15;
  char *d1_15;
  int8_t ext_type_15;
  char *pcStack_450;
  uint32_t i_15;
  char *s1_15;
  char *local_440;
  char *d4_14;
  char *d3_14;
  char *s2_14;
  char *pcStack_420;
  uint32_t len2_14;
  char *d2_14;
  char *d1_14;
  int8_t ext_type_14;
  char *pcStack_408;
  uint32_t i_14;
  char *s1_14;
  char *local_3f8;
  char *d4_13;
  char *d3_13;
  char *s2_13;
  char *pcStack_3d8;
  uint32_t len2_13;
  char *d2_13;
  char *d1_13;
  int8_t ext_type_13;
  char *pcStack_3c0;
  uint32_t i_13;
  char *s1_13;
  char *local_3b0;
  char *d4_12;
  char *d3_12;
  char *s2_12;
  char *pcStack_390;
  uint32_t len2_12;
  char *d2_12;
  char *d1_12;
  int8_t ext_type_12;
  char *pcStack_378;
  uint32_t i_12;
  char *s1_12;
  char *local_368;
  char *d4_11;
  char *d3_11;
  char *s2_11;
  char *pcStack_348;
  uint32_t len2_11;
  char *d2_11;
  char *d1_11;
  int8_t ext_type_11;
  char *pcStack_330;
  uint32_t i_11;
  char *s1_11;
  char *local_320;
  char *d4_10;
  char *d3_10;
  char *s2_10;
  char *pcStack_300;
  uint32_t len2_10;
  char *d2_10;
  char *d1_10;
  int8_t ext_type_10;
  char *pcStack_2e8;
  uint32_t i_10;
  char *s1_10;
  char *local_2d8;
  char *d4_9;
  char *d3_9;
  char *s2_9;
  char *pcStack_2b8;
  uint32_t len2_9;
  char *d2_9;
  char *d1_9;
  int8_t ext_type_9;
  char *pcStack_2a0;
  uint32_t i_9;
  char *s1_9;
  char *local_290;
  char *d4_8;
  char *d3_8;
  char *s2_8;
  char *pcStack_270;
  uint32_t len2_8;
  char *d2_8;
  char *d1_8;
  int8_t ext_type_8;
  char *pcStack_258;
  uint32_t i_8;
  char *s1_8;
  char *local_248;
  char *d4_7;
  char *d3_7;
  char *s2_7;
  char *pcStack_228;
  uint32_t len2_7;
  char *d2_7;
  char *d1_7;
  int8_t ext_type_7;
  char *pcStack_210;
  uint32_t i_7;
  char *s1_7;
  char *local_200;
  char *d4_6;
  char *d3_6;
  char *s2_6;
  char *pcStack_1e0;
  uint32_t len2_6;
  char *d2_6;
  char *d1_6;
  int8_t ext_type_6;
  char *pcStack_1c8;
  uint32_t i_6;
  char *s1_6;
  char *local_1b8;
  char *d4_5;
  char *d3_5;
  char *s2_5;
  char *pcStack_198;
  uint32_t len2_5;
  char *d2_5;
  char *d1_5;
  int8_t ext_type_5;
  char *pcStack_180;
  uint32_t i_5;
  char *s1_5;
  char *local_170;
  char *d4_4;
  char *d3_4;
  char *s2_4;
  char *pcStack_150;
  uint32_t len2_4;
  char *d2_4;
  char *d1_4;
  int8_t ext_type_4;
  char *pcStack_138;
  uint32_t i_4;
  char *s1_4;
  char *local_128;
  char *d4_3;
  char *d3_3;
  char *s2_3;
  char *pcStack_108;
  uint32_t len2_3;
  char *d2_3;
  char *d1_3;
  int8_t ext_type_3;
  char *pcStack_f0;
  uint32_t i_3;
  char *s1_3;
  char *local_e0;
  char *d4_2;
  char *d3_2;
  char *s2_2;
  char *pcStack_c0;
  uint32_t len2_2;
  char *d2_2;
  char *d1_2;
  int8_t ext_type_2;
  char *pcStack_a8;
  uint32_t i_2;
  char *s1_2;
  char *local_98;
  char *d4_1;
  char *d3_1;
  char *s2_1;
  char *pcStack_78;
  uint32_t len2_1;
  char *d2_1;
  char *d1_1;
  int8_t ext_type_1;
  char *pcStack_60;
  uint32_t i_1;
  char *s1_1;
  char *local_50;
  char *d4;
  char *d3;
  char *s2;
  char *pcStack_30;
  uint32_t len2;
  char *d2;
  char *d1;
  int8_t ext_type;
  char *pcStack_18;
  uint32_t i;
  char *s1;
  
  _plan(0xec,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_exts");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x01");
  s1._4_4_ = fprintf(_stdout,"\n");
  pcStack_18 = str;
  d1._4_4_ = 0;
  while (d1._4_4_ == 0) {
    str[0] = 'a';
    d1._4_4_ = 1;
  }
  d1._3_1_ = '\0';
  d2 = mp_encode_ext(data,'\0',str,1);
  pcStack_30 = data;
  d3 = mp_decode_ext(&stack0xffffffffffffffd0,(int8_t *)((long)&d1 + 3),(uint32_t *)((long)&s2 + 4))
  ;
  _ok((uint)(s2._4_4_ == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_ext(x, %u))",1);
  _ok((uint)(d1._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "type(mp_decode_ext(x))");
  pcStack_30 = data;
  mp_decode_ext(&stack0xffffffffffffffd0,(int8_t *)((long)&d1 + 3),(uint32_t *)((long)&s2 + 4));
  _ok((uint)(s2._4_4_ == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_strbin(x, %u))",1);
  d4 = data;
  mp_next(&d4);
  local_50 = data;
  iVar7 = mp_check(&local_50,d4 + 1);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_check_ext(mp_encode_ext(x, 0x01))");
  _ok((uint)(d2 == pcStack_30),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_ext(x, 0x01)");
  _ok((uint)(d2 == d4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_next_ext(x, 0x01)");
  _ok((uint)(d2 == local_50),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_check_ext(x, 0x01)");
  uVar8 = mp_sizeof_ext(1);
  _ok((uint)(uVar8 == (int)d2 - (int)data),"mp_sizeof_ext(0x01) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_sizeof_ext(0x01)");
  iVar7 = memcmp(pcStack_18,d3,1);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x01) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_encode_ext(x, 0x01) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x02");
  s1_1._4_4_ = fprintf(_stdout,"\n");
  pcStack_60 = str;
  for (d1_1._4_4_ = 0; d1_1._4_4_ < 2; d1_1._4_4_ = d1_1._4_4_ + 1) {
    str[d1_1._4_4_] = (char)((ulong)d1_1._4_4_ % 0x1a) + 'a';
  }
  d1_1._3_1_ = '\0';
  d2_1 = mp_encode_ext(data,'\0',str,2);
  pcStack_78 = data;
  d3_1 = mp_decode_ext(&stack0xffffffffffffff88,(int8_t *)((long)&d1_1 + 3),
                       (uint32_t *)((long)&s2_1 + 4));
  _ok((uint)(s2_1._4_4_ == 2),"0x02 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_ext(x, %u))",2);
  _ok((uint)(d1_1._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "type(mp_decode_ext(x))");
  pcStack_78 = data;
  mp_decode_ext(&stack0xffffffffffffff88,(int8_t *)((long)&d1_1 + 3),(uint32_t *)((long)&s2_1 + 4));
  _ok((uint)(s2_1._4_4_ == 2),"0x02 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_strbin(x, %u))",2);
  d4_1 = data;
  mp_next(&d4_1);
  local_98 = data;
  iVar7 = mp_check(&local_98,d4_1 + 2);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x02)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_check_ext(mp_encode_ext(x, 0x02))");
  _ok((uint)(d2_1 == pcStack_78),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_ext(x, 0x02)");
  _ok((uint)(d2_1 == d4_1),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_next_ext(x, 0x02)");
  _ok((uint)(d2_1 == local_98),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_check_ext(x, 0x02)");
  uVar8 = mp_sizeof_ext(2);
  _ok((uint)(uVar8 == (int)d2_1 - (int)data),"mp_sizeof_ext(0x02) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_sizeof_ext(0x02)");
  _ok((uint)(*(short *)pcStack_60 == *(short *)d3_1),"memcmp(s1, s2, 0x02) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_encode_ext(x, 0x02) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x03");
  s1_2._4_4_ = fprintf(_stdout,"\n");
  pcStack_a8 = str;
  for (d1_2._4_4_ = 0; d1_2._4_4_ < 3; d1_2._4_4_ = d1_2._4_4_ + 1) {
    str[d1_2._4_4_] = (char)((ulong)d1_2._4_4_ % 0x1a) + 'a';
  }
  d1_2._3_1_ = '\0';
  d2_2 = mp_encode_ext(data,'\0',str,3);
  pcStack_c0 = data;
  d3_2 = mp_decode_ext(&stack0xffffffffffffff40,(int8_t *)((long)&d1_2 + 3),
                       (uint32_t *)((long)&s2_2 + 4));
  _ok((uint)(s2_2._4_4_ == 3),"0x03 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_ext(x, %u))",3);
  _ok((uint)(d1_2._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "type(mp_decode_ext(x))");
  pcStack_c0 = data;
  mp_decode_ext(&stack0xffffffffffffff40,(int8_t *)((long)&d1_2 + 3),(uint32_t *)((long)&s2_2 + 4));
  _ok((uint)(s2_2._4_4_ == 3),"0x03 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_strbin(x, %u))",3);
  d4_2 = data;
  mp_next(&d4_2);
  local_e0 = data;
  iVar7 = mp_check(&local_e0,d4_2 + 3);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x03)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_check_ext(mp_encode_ext(x, 0x03))");
  _ok((uint)(d2_2 == pcStack_c0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_ext(x, 0x03)");
  _ok((uint)(d2_2 == d4_2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_next_ext(x, 0x03)");
  _ok((uint)(d2_2 == local_e0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_check_ext(x, 0x03)");
  uVar8 = mp_sizeof_ext(3);
  _ok((uint)(uVar8 == (int)d2_2 - (int)data),"mp_sizeof_ext(0x03) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_sizeof_ext(0x03)");
  iVar7 = memcmp(pcStack_a8,d3_2,3);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x03) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_encode_ext(x, 0x03) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x04");
  s1_3._4_4_ = fprintf(_stdout,"\n");
  pcStack_f0 = str;
  for (d1_3._4_4_ = 0; d1_3._4_4_ < 4; d1_3._4_4_ = d1_3._4_4_ + 1) {
    str[d1_3._4_4_] = (char)((ulong)d1_3._4_4_ % 0x1a) + 'a';
  }
  d1_3._3_1_ = '\0';
  d2_3 = mp_encode_ext(data,'\0',str,4);
  pcStack_108 = data;
  d3_3 = mp_decode_ext(&stack0xfffffffffffffef8,(int8_t *)((long)&d1_3 + 3),
                       (uint32_t *)((long)&s2_3 + 4));
  _ok((uint)(s2_3._4_4_ == 4),"0x04 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_ext(x, %u))",4);
  _ok((uint)(d1_3._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "type(mp_decode_ext(x))");
  pcStack_108 = data;
  mp_decode_ext(&stack0xfffffffffffffef8,(int8_t *)((long)&d1_3 + 3),(uint32_t *)((long)&s2_3 + 4));
  _ok((uint)(s2_3._4_4_ == 4),"0x04 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_strbin(x, %u))",4);
  d4_3 = data;
  mp_next(&d4_3);
  local_128 = data;
  iVar7 = mp_check(&local_128,d4_3 + 4);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x04)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_check_ext(mp_encode_ext(x, 0x04))");
  _ok((uint)(d2_3 == pcStack_108),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_ext(x, 0x04)");
  _ok((uint)(d2_3 == d4_3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_next_ext(x, 0x04)");
  _ok((uint)(d2_3 == local_128),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_check_ext(x, 0x04)");
  uVar8 = mp_sizeof_ext(4);
  _ok((uint)(uVar8 == (int)d2_3 - (int)data),"mp_sizeof_ext(0x04) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_sizeof_ext(0x04)");
  _ok((uint)(*(int *)pcStack_f0 == *(int *)d3_3),"memcmp(s1, s2, 0x04) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_encode_ext(x, 0x04) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x05");
  s1_4._4_4_ = fprintf(_stdout,"\n");
  pcStack_138 = str;
  for (d1_4._4_4_ = 0; d1_4._4_4_ < 5; d1_4._4_4_ = d1_4._4_4_ + 1) {
    str[d1_4._4_4_] = (char)((ulong)d1_4._4_4_ % 0x1a) + 'a';
  }
  d1_4._3_1_ = '\0';
  d2_4 = mp_encode_ext(data,'\0',str,5);
  pcStack_150 = data;
  d3_4 = mp_decode_ext(&stack0xfffffffffffffeb0,(int8_t *)((long)&d1_4 + 3),
                       (uint32_t *)((long)&s2_4 + 4));
  _ok((uint)(s2_4._4_4_ == 5),"0x05 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_ext(x, %u))",5);
  _ok((uint)(d1_4._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "type(mp_decode_ext(x))");
  pcStack_150 = data;
  mp_decode_ext(&stack0xfffffffffffffeb0,(int8_t *)((long)&d1_4 + 3),(uint32_t *)((long)&s2_4 + 4));
  _ok((uint)(s2_4._4_4_ == 5),"0x05 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_strbin(x, %u))",5);
  d4_4 = data;
  mp_next(&d4_4);
  local_170 = data;
  iVar7 = mp_check(&local_170,d4_4 + 5);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x05)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_check_ext(mp_encode_ext(x, 0x05))");
  _ok((uint)(d2_4 == pcStack_150),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_ext(x, 0x05)");
  _ok((uint)(d2_4 == d4_4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_next_ext(x, 0x05)");
  _ok((uint)(d2_4 == local_170),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_check_ext(x, 0x05)");
  uVar8 = mp_sizeof_ext(5);
  _ok((uint)(uVar8 == (int)d2_4 - (int)data),"mp_sizeof_ext(0x05) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_sizeof_ext(0x05)");
  iVar7 = memcmp(pcStack_138,d3_4,5);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x05) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_encode_ext(x, 0x05) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x06");
  s1_5._4_4_ = fprintf(_stdout,"\n");
  pcStack_180 = str;
  for (d1_5._4_4_ = 0; d1_5._4_4_ < 6; d1_5._4_4_ = d1_5._4_4_ + 1) {
    str[d1_5._4_4_] = (char)((ulong)d1_5._4_4_ % 0x1a) + 'a';
  }
  d1_5._3_1_ = '\0';
  d2_5 = mp_encode_ext(data,'\0',str,6);
  pcStack_198 = data;
  d3_5 = mp_decode_ext(&stack0xfffffffffffffe68,(int8_t *)((long)&d1_5 + 3),
                       (uint32_t *)((long)&s2_5 + 4));
  _ok((uint)(s2_5._4_4_ == 6),"0x06 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_ext(x, %u))",6);
  _ok((uint)(d1_5._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "type(mp_decode_ext(x))");
  pcStack_198 = data;
  mp_decode_ext(&stack0xfffffffffffffe68,(int8_t *)((long)&d1_5 + 3),(uint32_t *)((long)&s2_5 + 4));
  _ok((uint)(s2_5._4_4_ == 6),"0x06 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_strbin(x, %u))",6);
  d4_5 = data;
  mp_next(&d4_5);
  local_1b8 = data;
  iVar7 = mp_check(&local_1b8,d4_5 + 6);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x06)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_check_ext(mp_encode_ext(x, 0x06))");
  _ok((uint)(d2_5 == pcStack_198),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_ext(x, 0x06)");
  _ok((uint)(d2_5 == d4_5),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_next_ext(x, 0x06)");
  _ok((uint)(d2_5 == local_1b8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_check_ext(x, 0x06)");
  uVar8 = mp_sizeof_ext(6);
  _ok((uint)(uVar8 == (int)d2_5 - (int)data),"mp_sizeof_ext(0x06) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_sizeof_ext(0x06)");
  iVar7 = memcmp(pcStack_180,d3_5,6);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x06) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_encode_ext(x, 0x06) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x07");
  s1_6._4_4_ = fprintf(_stdout,"\n");
  pcStack_1c8 = str;
  for (d1_6._4_4_ = 0; d1_6._4_4_ < 7; d1_6._4_4_ = d1_6._4_4_ + 1) {
    str[d1_6._4_4_] = (char)((ulong)d1_6._4_4_ % 0x1a) + 'a';
  }
  d1_6._3_1_ = '\0';
  d2_6 = mp_encode_ext(data,'\0',str,7);
  pcStack_1e0 = data;
  d3_6 = mp_decode_ext(&stack0xfffffffffffffe20,(int8_t *)((long)&d1_6 + 3),
                       (uint32_t *)((long)&s2_6 + 4));
  _ok((uint)(s2_6._4_4_ == 7),"0x07 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_ext(x, %u))",7);
  _ok((uint)(d1_6._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "type(mp_decode_ext(x))");
  pcStack_1e0 = data;
  mp_decode_ext(&stack0xfffffffffffffe20,(int8_t *)((long)&d1_6 + 3),(uint32_t *)((long)&s2_6 + 4));
  _ok((uint)(s2_6._4_4_ == 7),"0x07 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_strbin(x, %u))",7);
  d4_6 = data;
  mp_next(&d4_6);
  local_200 = data;
  iVar7 = mp_check(&local_200,d4_6 + 7);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x07)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_check_ext(mp_encode_ext(x, 0x07))");
  _ok((uint)(d2_6 == pcStack_1e0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_ext(x, 0x07)");
  _ok((uint)(d2_6 == d4_6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_next_ext(x, 0x07)");
  _ok((uint)(d2_6 == local_200),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_check_ext(x, 0x07)");
  uVar8 = mp_sizeof_ext(7);
  _ok((uint)(uVar8 == (int)d2_6 - (int)data),"mp_sizeof_ext(0x07) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_sizeof_ext(0x07)");
  iVar7 = memcmp(pcStack_1c8,d3_6,7);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x07) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_encode_ext(x, 0x07) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x08");
  s1_7._4_4_ = fprintf(_stdout,"\n");
  pcStack_210 = str;
  for (d1_7._4_4_ = 0; d1_7._4_4_ < 8; d1_7._4_4_ = d1_7._4_4_ + 1) {
    str[d1_7._4_4_] = (char)((ulong)d1_7._4_4_ % 0x1a) + 'a';
  }
  d1_7._3_1_ = '\0';
  d2_7 = mp_encode_ext(data,'\0',str,8);
  pcStack_228 = data;
  d3_7 = mp_decode_ext(&stack0xfffffffffffffdd8,(int8_t *)((long)&d1_7 + 3),
                       (uint32_t *)((long)&s2_7 + 4));
  _ok((uint)(s2_7._4_4_ == 8),"0x08 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_ext(x, %u))",8);
  _ok((uint)(d1_7._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "type(mp_decode_ext(x))");
  pcStack_228 = data;
  mp_decode_ext(&stack0xfffffffffffffdd8,(int8_t *)((long)&d1_7 + 3),(uint32_t *)((long)&s2_7 + 4));
  _ok((uint)(s2_7._4_4_ == 8),"0x08 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_strbin(x, %u))",8);
  d4_7 = data;
  mp_next(&d4_7);
  local_248 = data;
  iVar7 = mp_check(&local_248,d4_7 + 8);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x08)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_check_ext(mp_encode_ext(x, 0x08))");
  _ok((uint)(d2_7 == pcStack_228),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_ext(x, 0x08)");
  _ok((uint)(d2_7 == d4_7),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_next_ext(x, 0x08)");
  _ok((uint)(d2_7 == local_248),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_check_ext(x, 0x08)");
  uVar8 = mp_sizeof_ext(8);
  _ok((uint)(uVar8 == (int)d2_7 - (int)data),"mp_sizeof_ext(0x08) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_sizeof_ext(0x08)");
  _ok((uint)(*(long *)pcStack_210 == *(long *)d3_7),"memcmp(s1, s2, 0x08) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_encode_ext(x, 0x08) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x09");
  s1_8._4_4_ = fprintf(_stdout,"\n");
  pcStack_258 = str;
  for (d1_8._4_4_ = 0; d1_8._4_4_ < 9; d1_8._4_4_ = d1_8._4_4_ + 1) {
    str[d1_8._4_4_] = (char)((ulong)d1_8._4_4_ % 0x1a) + 'a';
  }
  d1_8._3_1_ = '\0';
  d2_8 = mp_encode_ext(data,'\0',str,9);
  pcStack_270 = data;
  d3_8 = mp_decode_ext(&stack0xfffffffffffffd90,(int8_t *)((long)&d1_8 + 3),
                       (uint32_t *)((long)&s2_8 + 4));
  _ok((uint)(s2_8._4_4_ == 9),"0x09 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_ext(x, %u))",9);
  _ok((uint)(d1_8._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "type(mp_decode_ext(x))");
  pcStack_270 = data;
  mp_decode_ext(&stack0xfffffffffffffd90,(int8_t *)((long)&d1_8 + 3),(uint32_t *)((long)&s2_8 + 4));
  _ok((uint)(s2_8._4_4_ == 9),"0x09 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_strbin(x, %u))",9);
  d4_8 = data;
  mp_next(&d4_8);
  local_290 = data;
  iVar7 = mp_check(&local_290,d4_8 + 9);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x09)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_check_ext(mp_encode_ext(x, 0x09))");
  _ok((uint)(d2_8 == pcStack_270),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_ext(x, 0x09)");
  _ok((uint)(d2_8 == d4_8),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_next_ext(x, 0x09)");
  _ok((uint)(d2_8 == local_290),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_check_ext(x, 0x09)");
  uVar8 = mp_sizeof_ext(9);
  _ok((uint)(uVar8 == (int)d2_8 - (int)data),"mp_sizeof_ext(0x09) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_sizeof_ext(0x09)");
  iVar7 = memcmp(pcStack_258,d3_8,9);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x09) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_encode_ext(x, 0x09) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0a");
  s1_9._4_4_ = fprintf(_stdout,"\n");
  pcStack_2a0 = str;
  for (d1_9._4_4_ = 0; d1_9._4_4_ < 10; d1_9._4_4_ = d1_9._4_4_ + 1) {
    str[d1_9._4_4_] = (char)((ulong)d1_9._4_4_ % 0x1a) + 'a';
  }
  d1_9._3_1_ = '\0';
  d2_9 = mp_encode_ext(data,'\0',str,10);
  pcStack_2b8 = data;
  d3_9 = mp_decode_ext(&stack0xfffffffffffffd48,(int8_t *)((long)&d1_9 + 3),
                       (uint32_t *)((long)&s2_9 + 4));
  _ok((uint)(s2_9._4_4_ == 10),"0x0a == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_ext(x, %u))",10);
  _ok((uint)(d1_9._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "type(mp_decode_ext(x))");
  pcStack_2b8 = data;
  mp_decode_ext(&stack0xfffffffffffffd48,(int8_t *)((long)&d1_9 + 3),(uint32_t *)((long)&s2_9 + 4));
  _ok((uint)(s2_9._4_4_ == 10),"0x0a == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_strbin(x, %u))",10);
  d4_9 = data;
  mp_next(&d4_9);
  local_2d8 = data;
  iVar7 = mp_check(&local_2d8,d4_9 + 10);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0a)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_check_ext(mp_encode_ext(x, 0x0a))");
  _ok((uint)(d2_9 == pcStack_2b8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_ext(x, 0x0a)");
  _ok((uint)(d2_9 == d4_9),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_next_ext(x, 0x0a)");
  _ok((uint)(d2_9 == local_2d8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_check_ext(x, 0x0a)");
  uVar8 = mp_sizeof_ext(10);
  _ok((uint)(uVar8 == (int)d2_9 - (int)data),"mp_sizeof_ext(0x0a) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_sizeof_ext(0x0a)");
  iVar7 = memcmp(pcStack_2a0,d3_9,10);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0a) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_encode_ext(x, 0x0a) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0b");
  s1_10._4_4_ = fprintf(_stdout,"\n");
  pcStack_2e8 = str;
  for (d1_10._4_4_ = 0; d1_10._4_4_ < 0xb; d1_10._4_4_ = d1_10._4_4_ + 1) {
    str[d1_10._4_4_] = (char)((ulong)d1_10._4_4_ % 0x1a) + 'a';
  }
  d1_10._3_1_ = '\0';
  d2_10 = mp_encode_ext(data,'\0',str,0xb);
  pcStack_300 = data;
  d3_10 = mp_decode_ext(&stack0xfffffffffffffd00,(int8_t *)((long)&d1_10 + 3),
                        (uint32_t *)((long)&s2_10 + 4));
  _ok((uint)(s2_10._4_4_ == 0xb),"0x0b == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_ext(x, %u))",0xb);
  _ok((uint)(d1_10._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "type(mp_decode_ext(x))");
  pcStack_300 = data;
  mp_decode_ext(&stack0xfffffffffffffd00,(int8_t *)((long)&d1_10 + 3),(uint32_t *)((long)&s2_10 + 4)
               );
  _ok((uint)(s2_10._4_4_ == 0xb),"0x0b == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_strbin(x, %u))",0xb);
  d4_10 = data;
  mp_next(&d4_10);
  local_320 = data;
  iVar7 = mp_check(&local_320,d4_10 + 0xb);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0b)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_check_ext(mp_encode_ext(x, 0x0b))");
  _ok((uint)(d2_10 == pcStack_300),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_ext(x, 0x0b)");
  _ok((uint)(d2_10 == d4_10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_next_ext(x, 0x0b)");
  _ok((uint)(d2_10 == local_320),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_check_ext(x, 0x0b)");
  uVar8 = mp_sizeof_ext(0xb);
  _ok((uint)(uVar8 == (int)d2_10 - (int)data),"mp_sizeof_ext(0x0b) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_sizeof_ext(0x0b)");
  iVar7 = memcmp(pcStack_2e8,d3_10,0xb);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0b) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_encode_ext(x, 0x0b) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0c");
  s1_11._4_4_ = fprintf(_stdout,"\n");
  pcStack_330 = str;
  for (d1_11._4_4_ = 0; d1_11._4_4_ < 0xc; d1_11._4_4_ = d1_11._4_4_ + 1) {
    str[d1_11._4_4_] = (char)((ulong)d1_11._4_4_ % 0x1a) + 'a';
  }
  d1_11._3_1_ = '\0';
  d2_11 = mp_encode_ext(data,'\0',str,0xc);
  pcStack_348 = data;
  d3_11 = mp_decode_ext(&stack0xfffffffffffffcb8,(int8_t *)((long)&d1_11 + 3),
                        (uint32_t *)((long)&s2_11 + 4));
  _ok((uint)(s2_11._4_4_ == 0xc),"0x0c == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_ext(x, %u))",0xc);
  _ok((uint)(d1_11._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "type(mp_decode_ext(x))");
  pcStack_348 = data;
  mp_decode_ext(&stack0xfffffffffffffcb8,(int8_t *)((long)&d1_11 + 3),(uint32_t *)((long)&s2_11 + 4)
               );
  _ok((uint)(s2_11._4_4_ == 0xc),"0x0c == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_strbin(x, %u))",0xc);
  d4_11 = data;
  mp_next(&d4_11);
  local_368 = data;
  iVar7 = mp_check(&local_368,d4_11 + 0xc);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0c)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_check_ext(mp_encode_ext(x, 0x0c))");
  _ok((uint)(d2_11 == pcStack_348),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_ext(x, 0x0c)");
  _ok((uint)(d2_11 == d4_11),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_next_ext(x, 0x0c)");
  _ok((uint)(d2_11 == local_368),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_check_ext(x, 0x0c)");
  uVar8 = mp_sizeof_ext(0xc);
  _ok((uint)(uVar8 == (int)d2_11 - (int)data),"mp_sizeof_ext(0x0c) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_sizeof_ext(0x0c)");
  iVar7 = memcmp(pcStack_330,d3_11,0xc);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0c) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_encode_ext(x, 0x0c) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0d");
  s1_12._4_4_ = fprintf(_stdout,"\n");
  pcStack_378 = str;
  for (d1_12._4_4_ = 0; d1_12._4_4_ < 0xd; d1_12._4_4_ = d1_12._4_4_ + 1) {
    str[d1_12._4_4_] = (char)((ulong)d1_12._4_4_ % 0x1a) + 'a';
  }
  d1_12._3_1_ = '\0';
  d2_12 = mp_encode_ext(data,'\0',str,0xd);
  pcStack_390 = data;
  d3_12 = mp_decode_ext(&stack0xfffffffffffffc70,(int8_t *)((long)&d1_12 + 3),
                        (uint32_t *)((long)&s2_12 + 4));
  _ok((uint)(s2_12._4_4_ == 0xd),"0x0d == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_ext(x, %u))",0xd);
  _ok((uint)(d1_12._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "type(mp_decode_ext(x))");
  pcStack_390 = data;
  mp_decode_ext(&stack0xfffffffffffffc70,(int8_t *)((long)&d1_12 + 3),(uint32_t *)((long)&s2_12 + 4)
               );
  _ok((uint)(s2_12._4_4_ == 0xd),"0x0d == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_strbin(x, %u))",0xd);
  d4_12 = data;
  mp_next(&d4_12);
  local_3b0 = data;
  iVar7 = mp_check(&local_3b0,d4_12 + 0xd);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0d)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_check_ext(mp_encode_ext(x, 0x0d))");
  _ok((uint)(d2_12 == pcStack_390),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_ext(x, 0x0d)");
  _ok((uint)(d2_12 == d4_12),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_next_ext(x, 0x0d)");
  _ok((uint)(d2_12 == local_3b0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_check_ext(x, 0x0d)");
  uVar8 = mp_sizeof_ext(0xd);
  _ok((uint)(uVar8 == (int)d2_12 - (int)data),"mp_sizeof_ext(0x0d) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_sizeof_ext(0x0d)");
  iVar7 = memcmp(pcStack_378,d3_12,0xd);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0d) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_encode_ext(x, 0x0d) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0e");
  s1_13._4_4_ = fprintf(_stdout,"\n");
  pcStack_3c0 = str;
  for (d1_13._4_4_ = 0; d1_13._4_4_ < 0xe; d1_13._4_4_ = d1_13._4_4_ + 1) {
    str[d1_13._4_4_] = (char)((ulong)d1_13._4_4_ % 0x1a) + 'a';
  }
  d1_13._3_1_ = '\0';
  d2_13 = mp_encode_ext(data,'\0',str,0xe);
  pcStack_3d8 = data;
  d3_13 = mp_decode_ext(&stack0xfffffffffffffc28,(int8_t *)((long)&d1_13 + 3),
                        (uint32_t *)((long)&s2_13 + 4));
  _ok((uint)(s2_13._4_4_ == 0xe),"0x0e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_ext(x, %u))",0xe);
  _ok((uint)(d1_13._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "type(mp_decode_ext(x))");
  pcStack_3d8 = data;
  mp_decode_ext(&stack0xfffffffffffffc28,(int8_t *)((long)&d1_13 + 3),(uint32_t *)((long)&s2_13 + 4)
               );
  _ok((uint)(s2_13._4_4_ == 0xe),"0x0e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_strbin(x, %u))",0xe);
  d4_13 = data;
  mp_next(&d4_13);
  local_3f8 = data;
  iVar7 = mp_check(&local_3f8,d4_13 + 0xe);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_check_ext(mp_encode_ext(x, 0x0e))");
  _ok((uint)(d2_13 == pcStack_3d8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_ext(x, 0x0e)");
  _ok((uint)(d2_13 == d4_13),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_next_ext(x, 0x0e)");
  _ok((uint)(d2_13 == local_3f8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_check_ext(x, 0x0e)");
  uVar8 = mp_sizeof_ext(0xe);
  _ok((uint)(uVar8 == (int)d2_13 - (int)data),"mp_sizeof_ext(0x0e) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_sizeof_ext(0x0e)");
  iVar7 = memcmp(pcStack_3c0,d3_13,0xe);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0e) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_encode_ext(x, 0x0e) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0f");
  s1_14._4_4_ = fprintf(_stdout,"\n");
  pcStack_408 = str;
  for (d1_14._4_4_ = 0; d1_14._4_4_ < 0xf; d1_14._4_4_ = d1_14._4_4_ + 1) {
    str[d1_14._4_4_] = (char)((ulong)d1_14._4_4_ % 0x1a) + 'a';
  }
  d1_14._3_1_ = '\0';
  d2_14 = mp_encode_ext(data,'\0',str,0xf);
  pcStack_420 = data;
  d3_14 = mp_decode_ext(&stack0xfffffffffffffbe0,(int8_t *)((long)&d1_14 + 3),
                        (uint32_t *)((long)&s2_14 + 4));
  _ok((uint)(s2_14._4_4_ == 0xf),"0x0f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_ext(x, %u))",0xf);
  _ok((uint)(d1_14._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "type(mp_decode_ext(x))");
  pcStack_420 = data;
  mp_decode_ext(&stack0xfffffffffffffbe0,(int8_t *)((long)&d1_14 + 3),(uint32_t *)((long)&s2_14 + 4)
               );
  _ok((uint)(s2_14._4_4_ == 0xf),"0x0f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_strbin(x, %u))",0xf);
  d4_14 = data;
  mp_next(&d4_14);
  local_440 = data;
  iVar7 = mp_check(&local_440,d4_14 + 0xf);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_check_ext(mp_encode_ext(x, 0x0f))");
  _ok((uint)(d2_14 == pcStack_420),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_ext(x, 0x0f)");
  _ok((uint)(d2_14 == d4_14),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_next_ext(x, 0x0f)");
  _ok((uint)(d2_14 == local_440),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_check_ext(x, 0x0f)");
  uVar8 = mp_sizeof_ext(0xf);
  _ok((uint)(uVar8 == (int)d2_14 - (int)data),"mp_sizeof_ext(0x0f) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_sizeof_ext(0x0f)");
  iVar7 = memcmp(pcStack_408,d3_14,0xf);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0f) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_encode_ext(x, 0x0f) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x10");
  s1_15._4_4_ = fprintf(_stdout,"\n");
  pcStack_450 = str;
  for (d1_15._4_4_ = 0; d1_15._4_4_ < 0x10; d1_15._4_4_ = d1_15._4_4_ + 1) {
    str[d1_15._4_4_] = (char)((ulong)d1_15._4_4_ % 0x1a) + 'a';
  }
  d1_15._3_1_ = '\0';
  d2_15 = mp_encode_ext(data,'\0',str,0x10);
  pcStack_468 = data;
  d3_15 = mp_decode_ext(&stack0xfffffffffffffb98,(int8_t *)((long)&d1_15 + 3),
                        (uint32_t *)((long)&s2_15 + 4));
  _ok((uint)(s2_15._4_4_ == 0x10),"0x10 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_ext(x, %u))",0x10);
  _ok((uint)(d1_15._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "type(mp_decode_ext(x))");
  pcStack_468 = data;
  mp_decode_ext(&stack0xfffffffffffffb98,(int8_t *)((long)&d1_15 + 3),(uint32_t *)((long)&s2_15 + 4)
               );
  _ok((uint)(s2_15._4_4_ == 0x10),"0x10 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_strbin(x, %u))",0x10);
  d4_15 = data;
  mp_next(&d4_15);
  local_488 = data;
  iVar7 = mp_check(&local_488,d4_15 + 0x10);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x10)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_check_ext(mp_encode_ext(x, 0x10))");
  _ok((uint)(d2_15 == pcStack_468),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_ext(x, 0x10)");
  _ok((uint)(d2_15 == d4_15),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_next_ext(x, 0x10)");
  _ok((uint)(d2_15 == local_488),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_check_ext(x, 0x10)");
  uVar8 = mp_sizeof_ext(0x10);
  _ok((uint)(uVar8 == (int)d2_15 - (int)data),"mp_sizeof_ext(0x10) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_sizeof_ext(0x10)");
  auVar1 = *(undefined1 (*) [16])d3_15;
  cVar10 = -(*pcStack_450 == auVar1[0]);
  cVar11 = -(pcStack_450[1] == auVar1[1]);
  cVar12 = -(pcStack_450[2] == auVar1[2]);
  cVar13 = -(pcStack_450[3] == auVar1[3]);
  cVar14 = -(pcStack_450[4] == auVar1[4]);
  cVar15 = -(pcStack_450[5] == auVar1[5]);
  cVar16 = -(pcStack_450[6] == auVar1[6]);
  cVar17 = -(pcStack_450[7] == auVar1[7]);
  cVar18 = -(pcStack_450[8] == auVar1[8]);
  cVar19 = -(pcStack_450[9] == auVar1[9]);
  cVar20 = -(pcStack_450[10] == auVar1[10]);
  cVar21 = -(pcStack_450[0xb] == auVar1[0xb]);
  cVar22 = -(pcStack_450[0xc] == auVar1[0xc]);
  cVar23 = -(pcStack_450[0xd] == auVar1[0xd]);
  cVar24 = -(pcStack_450[0xe] == auVar1[0xe]);
  bVar25 = -(pcStack_450[0xf] == auVar1[0xf]);
  auVar1[1] = cVar11;
  auVar1[0] = cVar10;
  auVar1[2] = cVar12;
  auVar1[3] = cVar13;
  auVar1[4] = cVar14;
  auVar1[5] = cVar15;
  auVar1[6] = cVar16;
  auVar1[7] = cVar17;
  auVar1[8] = cVar18;
  auVar1[9] = cVar19;
  auVar1[10] = cVar20;
  auVar1[0xb] = cVar21;
  auVar1[0xc] = cVar22;
  auVar1[0xd] = cVar23;
  auVar1[0xe] = cVar24;
  auVar1[0xf] = bVar25;
  auVar2[1] = cVar11;
  auVar2[0] = cVar10;
  auVar2[2] = cVar12;
  auVar2[3] = cVar13;
  auVar2[4] = cVar14;
  auVar2[5] = cVar15;
  auVar2[6] = cVar16;
  auVar2[7] = cVar17;
  auVar2[8] = cVar18;
  auVar2[9] = cVar19;
  auVar2[10] = cVar20;
  auVar2[0xb] = cVar21;
  auVar2[0xc] = cVar22;
  auVar2[0xd] = cVar23;
  auVar2[0xe] = cVar24;
  auVar2[0xf] = bVar25;
  auVar6[1] = cVar13;
  auVar6[0] = cVar12;
  auVar6[2] = cVar14;
  auVar6[3] = cVar15;
  auVar6[4] = cVar16;
  auVar6[5] = cVar17;
  auVar6[6] = cVar18;
  auVar6[7] = cVar19;
  auVar6[8] = cVar20;
  auVar6[9] = cVar21;
  auVar6[10] = cVar22;
  auVar6[0xb] = cVar23;
  auVar6[0xc] = cVar24;
  auVar6[0xd] = bVar25;
  auVar5[1] = cVar14;
  auVar5[0] = cVar13;
  auVar5[2] = cVar15;
  auVar5[3] = cVar16;
  auVar5[4] = cVar17;
  auVar5[5] = cVar18;
  auVar5[6] = cVar19;
  auVar5[7] = cVar20;
  auVar5[8] = cVar21;
  auVar5[9] = cVar22;
  auVar5[10] = cVar23;
  auVar5[0xb] = cVar24;
  auVar5[0xc] = bVar25;
  auVar4[1] = cVar15;
  auVar4[0] = cVar14;
  auVar4[2] = cVar16;
  auVar4[3] = cVar17;
  auVar4[4] = cVar18;
  auVar4[5] = cVar19;
  auVar4[6] = cVar20;
  auVar4[7] = cVar21;
  auVar4[8] = cVar22;
  auVar4[9] = cVar23;
  auVar4[10] = cVar24;
  auVar4[0xb] = bVar25;
  auVar3[1] = cVar16;
  auVar3[0] = cVar15;
  auVar3[2] = cVar17;
  auVar3[3] = cVar18;
  auVar3[4] = cVar19;
  auVar3[5] = cVar20;
  auVar3[6] = cVar21;
  auVar3[7] = cVar22;
  auVar3[8] = cVar23;
  auVar3[9] = cVar24;
  auVar3[10] = bVar25;
  _ok((uint)((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(
                                                  cVar22,CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(
                                                  cVar19,CONCAT12(cVar18,CONCAT11(cVar17,cVar16)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(
                                                  cVar22,CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(
                                                  cVar19,CONCAT11(cVar18,cVar17)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar25 >> 7) << 0xf) == 0xffff),"memcmp(s1, s2, 0x10) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_encode_ext(x, 0x10) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x11");
  s1_16._4_4_ = fprintf(_stdout,"\n");
  pcStack_498 = str;
  for (d1_16._4_4_ = 0; d1_16._4_4_ < 0x11; d1_16._4_4_ = d1_16._4_4_ + 1) {
    str[d1_16._4_4_] = (char)((ulong)d1_16._4_4_ % 0x1a) + 'a';
  }
  d1_16._3_1_ = '\0';
  d2_16 = mp_encode_ext(data,'\0',str,0x11);
  pcStack_4b0 = data;
  d3_16 = mp_decode_ext(&stack0xfffffffffffffb50,(int8_t *)((long)&d1_16 + 3),
                        (uint32_t *)((long)&s2_16 + 4));
  _ok((uint)(s2_16._4_4_ == 0x11),"0x11 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_ext(x, %u))",0x11);
  _ok((uint)(d1_16._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "type(mp_decode_ext(x))");
  pcStack_4b0 = data;
  mp_decode_ext(&stack0xfffffffffffffb50,(int8_t *)((long)&d1_16 + 3),(uint32_t *)((long)&s2_16 + 4)
               );
  _ok((uint)(s2_16._4_4_ == 0x11),"0x11 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_strbin(x, %u))",0x11);
  d4_16 = data;
  mp_next(&d4_16);
  local_4d0 = data;
  iVar7 = mp_check(&local_4d0,d4_16 + 0x11);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x11)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_check_ext(mp_encode_ext(x, 0x11))");
  _ok((uint)(d2_16 == pcStack_4b0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_ext(x, 0x11)");
  _ok((uint)(d2_16 == d4_16),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_next_ext(x, 0x11)");
  _ok((uint)(d2_16 == local_4d0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_check_ext(x, 0x11)");
  uVar8 = mp_sizeof_ext(0x11);
  _ok((uint)(uVar8 == (int)d2_16 - (int)data),"mp_sizeof_ext(0x11) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_sizeof_ext(0x11)");
  iVar7 = memcmp(pcStack_498,d3_16,0x11);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x11) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_encode_ext(x, 0x11) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0xfe");
  s1_17._4_4_ = fprintf(_stdout,"\n");
  pcStack_4e0 = str;
  for (d1_17._4_4_ = 0; d1_17._4_4_ < 0xfe; d1_17._4_4_ = d1_17._4_4_ + 1) {
    str[d1_17._4_4_] = (char)((ulong)d1_17._4_4_ % 0x1a) + 'a';
  }
  d1_17._3_1_ = '\0';
  d2_17 = mp_encode_ext(data,'\0',str,0xfe);
  pcStack_4f8 = data;
  d3_17 = mp_decode_ext(&stack0xfffffffffffffb08,(int8_t *)((long)&d1_17 + 3),
                        (uint32_t *)((long)&s2_17 + 4));
  _ok((uint)(s2_17._4_4_ == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_ext(x, %u))",0xfe);
  _ok((uint)(d1_17._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "type(mp_decode_ext(x))");
  pcStack_4f8 = data;
  mp_decode_ext(&stack0xfffffffffffffb08,(int8_t *)((long)&d1_17 + 3),(uint32_t *)((long)&s2_17 + 4)
               );
  _ok((uint)(s2_17._4_4_ == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_strbin(x, %u))",0xfe);
  d4_17 = data;
  mp_next(&d4_17);
  local_518 = data;
  iVar7 = mp_check(&local_518,d4_17 + 0xfe);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xfe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_check_ext(mp_encode_ext(x, 0xfe))");
  _ok((uint)(d2_17 == pcStack_4f8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_ext(x, 0xfe)");
  _ok((uint)(d2_17 == d4_17),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_next_ext(x, 0xfe)");
  _ok((uint)(d2_17 == local_518),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_check_ext(x, 0xfe)");
  uVar8 = mp_sizeof_ext(0xfe);
  _ok((uint)(uVar8 == (int)d2_17 - (int)data),"mp_sizeof_ext(0xfe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_sizeof_ext(0xfe)");
  iVar7 = memcmp(pcStack_4e0,d3_17,0xfe);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0xfe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_encode_ext(x, 0xfe) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0xff");
  s1_18._4_4_ = fprintf(_stdout,"\n");
  pcStack_528 = str;
  for (d1_18._4_4_ = 0; d1_18._4_4_ < 0xff; d1_18._4_4_ = d1_18._4_4_ + 1) {
    str[d1_18._4_4_] = (char)((ulong)d1_18._4_4_ % 0x1a) + 'a';
  }
  d1_18._3_1_ = '\0';
  d2_18 = mp_encode_ext(data,'\0',str,0xff);
  pcStack_540 = data;
  d3_18 = mp_decode_ext(&stack0xfffffffffffffac0,(int8_t *)((long)&d1_18 + 3),
                        (uint32_t *)((long)&s2_18 + 4));
  _ok((uint)(s2_18._4_4_ == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_ext(x, %u))",0xff);
  _ok((uint)(d1_18._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "type(mp_decode_ext(x))");
  pcStack_540 = data;
  mp_decode_ext(&stack0xfffffffffffffac0,(int8_t *)((long)&d1_18 + 3),(uint32_t *)((long)&s2_18 + 4)
               );
  _ok((uint)(s2_18._4_4_ == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_strbin(x, %u))",0xff);
  d4_18 = data;
  mp_next(&d4_18);
  local_560 = data;
  iVar7 = mp_check(&local_560,d4_18 + 0xff);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_check_ext(mp_encode_ext(x, 0xff))");
  _ok((uint)(d2_18 == pcStack_540),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_ext(x, 0xff)");
  _ok((uint)(d2_18 == d4_18),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_next_ext(x, 0xff)");
  _ok((uint)(d2_18 == local_560),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_check_ext(x, 0xff)");
  uVar8 = mp_sizeof_ext(0xff);
  _ok((uint)(uVar8 == (int)d2_18 - (int)data),"mp_sizeof_ext(0xff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_sizeof_ext(0xff)");
  iVar7 = memcmp(pcStack_528,d3_18,0xff);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0xff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_encode_ext(x, 0xff) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0100");
  s1_19._4_4_ = fprintf(_stdout,"\n");
  pcStack_570 = str;
  for (d1_19._4_4_ = 0; d1_19._4_4_ < 0x100; d1_19._4_4_ = d1_19._4_4_ + 1) {
    str[d1_19._4_4_] = (char)((ulong)d1_19._4_4_ % 0x1a) + 'a';
  }
  d1_19._3_1_ = '\0';
  d2_19 = mp_encode_ext(data,'\0',str,0x100);
  pcStack_588 = data;
  d3_19 = mp_decode_ext(&stack0xfffffffffffffa78,(int8_t *)((long)&d1_19 + 3),
                        (uint32_t *)((long)&s2_19 + 4));
  _ok((uint)(s2_19._4_4_ == 0x100),"0x0100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_ext(x, %u))",0x100);
  _ok((uint)(d1_19._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "type(mp_decode_ext(x))");
  pcStack_588 = data;
  mp_decode_ext(&stack0xfffffffffffffa78,(int8_t *)((long)&d1_19 + 3),(uint32_t *)((long)&s2_19 + 4)
               );
  _ok((uint)(s2_19._4_4_ == 0x100),"0x0100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_strbin(x, %u))",0x100);
  d4_19 = data;
  mp_next(&d4_19);
  local_5a8 = data;
  iVar7 = mp_check(&local_5a8,d4_19 + 0x100);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0100)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_check_ext(mp_encode_ext(x, 0x0100))");
  _ok((uint)(d2_19 == pcStack_588),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_ext(x, 0x0100)");
  _ok((uint)(d2_19 == d4_19),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_next_ext(x, 0x0100)");
  _ok((uint)(d2_19 == local_5a8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_check_ext(x, 0x0100)");
  uVar8 = mp_sizeof_ext(0x100);
  _ok((uint)(uVar8 == (int)d2_19 - (int)data),"mp_sizeof_ext(0x0100) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_sizeof_ext(0x0100)");
  iVar7 = memcmp(pcStack_570,d3_19,0x100);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0100) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_encode_ext(x, 0x0100) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x0101");
  s1_20._4_4_ = fprintf(_stdout,"\n");
  pcStack_5b8 = str;
  for (d1_20._4_4_ = 0; d1_20._4_4_ < 0x101; d1_20._4_4_ = d1_20._4_4_ + 1) {
    str[d1_20._4_4_] = (char)((ulong)d1_20._4_4_ % 0x1a) + 'a';
  }
  d1_20._3_1_ = '\0';
  d2_20 = mp_encode_ext(data,'\0',str,0x101);
  pcStack_5d0 = data;
  d3_20 = mp_decode_ext(&stack0xfffffffffffffa30,(int8_t *)((long)&d1_20 + 3),
                        (uint32_t *)((long)&s2_20 + 4));
  _ok((uint)(s2_20._4_4_ == 0x101),"0x0101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_ext(x, %u))",0x101);
  _ok((uint)(d1_20._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "type(mp_decode_ext(x))");
  pcStack_5d0 = data;
  mp_decode_ext(&stack0xfffffffffffffa30,(int8_t *)((long)&d1_20 + 3),(uint32_t *)((long)&s2_20 + 4)
               );
  _ok((uint)(s2_20._4_4_ == 0x101),"0x0101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_strbin(x, %u))",0x101);
  d4_20 = data;
  mp_next(&d4_20);
  local_5f0 = data;
  iVar7 = mp_check(&local_5f0,d4_20 + 0x101);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x0101)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_check_ext(mp_encode_ext(x, 0x0101))");
  _ok((uint)(d2_20 == pcStack_5d0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_ext(x, 0x0101)");
  _ok((uint)(d2_20 == d4_20),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_next_ext(x, 0x0101)");
  _ok((uint)(d2_20 == local_5f0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_check_ext(x, 0x0101)");
  uVar8 = mp_sizeof_ext(0x101);
  _ok((uint)(uVar8 == (int)d2_20 - (int)data),"mp_sizeof_ext(0x0101) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_sizeof_ext(0x0101)");
  iVar7 = memcmp(pcStack_5b8,d3_20,0x101);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x0101) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_encode_ext(x, 0x0101) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0xfffe");
  s1_21._4_4_ = fprintf(_stdout,"\n");
  pcStack_600 = str;
  for (d1_21._4_4_ = 0; d1_21._4_4_ < 0xfffe; d1_21._4_4_ = d1_21._4_4_ + 1) {
    str[d1_21._4_4_] = (char)((ulong)d1_21._4_4_ % 0x1a) + 'a';
  }
  d1_21._3_1_ = '\0';
  d2_21 = mp_encode_ext(data,'\0',str,0xfffe);
  pcStack_618 = data;
  d3_21 = mp_decode_ext(&stack0xfffffffffffff9e8,(int8_t *)((long)&d1_21 + 3),
                        (uint32_t *)((long)&s2_21 + 4));
  _ok((uint)(s2_21._4_4_ == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_ext(x, %u))",0xfffe);
  _ok((uint)(d1_21._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "type(mp_decode_ext(x))");
  pcStack_618 = data;
  mp_decode_ext(&stack0xfffffffffffff9e8,(int8_t *)((long)&d1_21 + 3),(uint32_t *)((long)&s2_21 + 4)
               );
  _ok((uint)(s2_21._4_4_ == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_strbin(x, %u))",0xfffe);
  d4_21 = data;
  mp_next(&d4_21);
  local_638 = data;
  iVar7 = mp_check(&local_638,d4_21 + 0xfffe);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_check_ext(mp_encode_ext(x, 0xfffe))");
  _ok((uint)(d2_21 == pcStack_618),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_ext(x, 0xfffe)");
  _ok((uint)(d2_21 == d4_21),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_next_ext(x, 0xfffe)");
  _ok((uint)(d2_21 == local_638),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_check_ext(x, 0xfffe)");
  uVar8 = mp_sizeof_ext(0xfffe);
  _ok((uint)(uVar8 == (int)d2_21 - (int)data),"mp_sizeof_ext(0xfffe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_sizeof_ext(0xfffe)");
  iVar7 = memcmp(pcStack_600,d3_21,0xfffe);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0xfffe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_encode_ext(x, 0xfffe) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0xffff");
  s1_22._4_4_ = fprintf(_stdout,"\n");
  pcStack_648 = str;
  for (d1_22._4_4_ = 0; d1_22._4_4_ < 0xffff; d1_22._4_4_ = d1_22._4_4_ + 1) {
    str[d1_22._4_4_] = (char)((ulong)d1_22._4_4_ % 0x1a) + 'a';
  }
  d1_22._3_1_ = '\0';
  d2_22 = mp_encode_ext(data,'\0',str,0xffff);
  pcStack_660 = data;
  d3_22 = mp_decode_ext(&stack0xfffffffffffff9a0,(int8_t *)((long)&d1_22 + 3),
                        (uint32_t *)((long)&s2_22 + 4));
  _ok((uint)(s2_22._4_4_ == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_ext(x, %u))",0xffff);
  _ok((uint)(d1_22._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "type(mp_decode_ext(x))");
  pcStack_660 = data;
  mp_decode_ext(&stack0xfffffffffffff9a0,(int8_t *)((long)&d1_22 + 3),(uint32_t *)((long)&s2_22 + 4)
               );
  _ok((uint)(s2_22._4_4_ == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_strbin(x, %u))",0xffff);
  d4_22 = data;
  mp_next(&d4_22);
  local_680 = data;
  iVar7 = mp_check(&local_680,d4_22 + 0xffff);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_check_ext(mp_encode_ext(x, 0xffff))");
  _ok((uint)(d2_22 == pcStack_660),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_ext(x, 0xffff)");
  _ok((uint)(d2_22 == d4_22),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_next_ext(x, 0xffff)");
  _ok((uint)(d2_22 == local_680),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_check_ext(x, 0xffff)");
  uVar8 = mp_sizeof_ext(0xffff);
  _ok((uint)(uVar8 == (int)d2_22 - (int)data),"mp_sizeof_ext(0xffff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_sizeof_ext(0xffff)");
  iVar7 = memcmp(pcStack_648,d3_22,0xffff);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0xffff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_encode_ext(x, 0xffff) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x00010000");
  s1_23._4_4_ = fprintf(_stdout,"\n");
  pcStack_690 = str;
  for (d1_23._4_4_ = 0; d1_23._4_4_ < 0x10000; d1_23._4_4_ = d1_23._4_4_ + 1) {
    str[d1_23._4_4_] = (char)((ulong)d1_23._4_4_ % 0x1a) + 'a';
  }
  d1_23._3_1_ = '\0';
  d2_23 = mp_encode_ext(data,'\0',str,0x10000);
  pcStack_6a8 = data;
  d3_23 = mp_decode_ext(&stack0xfffffffffffff958,(int8_t *)((long)&d1_23 + 3),
                        (uint32_t *)((long)&s2_23 + 4));
  _ok((uint)(s2_23._4_4_ == 0x10000),"0x00010000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_ext(x, %u))",0x10000);
  _ok((uint)(d1_23._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "type(mp_decode_ext(x))");
  pcStack_6a8 = data;
  mp_decode_ext(&stack0xfffffffffffff958,(int8_t *)((long)&d1_23 + 3),(uint32_t *)((long)&s2_23 + 4)
               );
  _ok((uint)(s2_23._4_4_ == 0x10000),"0x00010000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_strbin(x, %u))",0x10000);
  d4_23 = data;
  mp_next(&d4_23);
  local_6c8 = data;
  iVar7 = mp_check(&local_6c8,d4_23 + 0x10000);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x00010000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_check_ext(mp_encode_ext(x, 0x00010000))");
  _ok((uint)(d2_23 == pcStack_6a8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_ext(x, 0x00010000)");
  _ok((uint)(d2_23 == d4_23),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_next_ext(x, 0x00010000)");
  _ok((uint)(d2_23 == local_6c8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_check_ext(x, 0x00010000)");
  uVar8 = mp_sizeof_ext(0x10000);
  _ok((uint)(uVar8 == (int)d2_23 - (int)data),"mp_sizeof_ext(0x00010000) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_sizeof_ext(0x00010000)");
  iVar7 = memcmp(pcStack_690,d3_23,0x10000);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x00010000) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_encode_ext(x, 0x00010000) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext len=0x00010001");
  s1_24._4_4_ = fprintf(_stdout,"\n");
  pcStack_6d8 = str;
  for (d1_24._4_4_ = 0; d1_24._4_4_ < 0x10001; d1_24._4_4_ = d1_24._4_4_ + 1) {
    str[d1_24._4_4_] = (char)((ulong)d1_24._4_4_ % 0x1a) + 'a';
  }
  d1_24._3_1_ = '\0';
  d2_24 = mp_encode_ext(data,'\0',str,0x10001);
  pcStack_6f0 = data;
  d3_24 = mp_decode_ext(&stack0xfffffffffffff910,(int8_t *)((long)&d1_24 + 3),
                        (uint32_t *)((long)&s2_24 + 4));
  _ok((uint)(s2_24._4_4_ == 0x10001),"0x00010001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_ext(x, %u))",0x10001);
  _ok((uint)(d1_24._3_1_ == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "type(mp_decode_ext(x))");
  pcStack_6f0 = data;
  mp_decode_ext(&stack0xfffffffffffff910,(int8_t *)((long)&d1_24 + 3),(uint32_t *)((long)&s2_24 + 4)
               );
  _ok((uint)(s2_24._4_4_ == 0x10001),"0x00010001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_strbin(x, %u))",0x10001);
  d4_24 = data;
  mp_next(&d4_24);
  pcStack_710 = data;
  iVar7 = mp_check(&stack0xfffffffffffff8f0,d4_24 + 0x10001);
  _ok((uint)((iVar7 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x00010001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_check_ext(mp_encode_ext(x, 0x00010001))");
  _ok((uint)(d2_24 == pcStack_6f0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_ext(x, 0x00010001)");
  _ok((uint)(d2_24 == d4_24),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_next_ext(x, 0x00010001)");
  _ok((uint)(d2_24 == pcStack_710),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_check_ext(x, 0x00010001)");
  uVar8 = mp_sizeof_ext(0x10001);
  _ok((uint)(uVar8 == (int)d2_24 - (int)data),"mp_sizeof_ext(0x00010001) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_sizeof_ext(0x00010001)");
  iVar7 = memcmp(pcStack_6d8,d3_24,0x10001);
  _ok((uint)(iVar7 == 0),"memcmp(s1, s2, 0x00010001) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_encode_ext(x, 0x00010001) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"ext_safe");
  sz._4_4_ = fprintf(_stdout,"\n");
  sz._3_1_ = '\0';
  uVar8 = mp_sizeof_extl(0xfe);
  __n = (ulong)uVar8;
  lStack_730 = __n + 0xfe;
  for (local_744 = 0; local_744 < 0xfe; local_744 = local_744 + 1) {
    str[local_744] = (char)((ulong)local_744 % 0x1a) + 'a';
  }
  mp_encode_extl((char *)((long)&d + 3),sz._3_1_,0xfe);
  hl = 0;
  pcVar9 = mp_encode_ext_safe((char *)0x0,&hl,sz._3_1_,str,0xfe);
  _ok((uint)(-hl == lStack_730),"-sz == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(NULL, &sz)");
  _ok((uint)(pcVar9 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "mp_encode_ext_safe(NULL, &sz)");
  hl = lStack_730;
  pcVar9 = mp_encode_ext_safe(data,&hl,sz._3_1_,str,0xfe);
  _ok((uint)(hl == 0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(buf, &sz)");
  _ok((uint)((long)pcVar9 - (long)data == lStack_730),"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "len of mp_encode_ext_safe(buf, &sz)");
  iVar7 = memcmp(data,(void *)((long)&d + 3),__n);
  _ok((uint)(iVar7 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "head of mp_encode_ext_safe(buf, &sz)");
  iVar7 = memcmp(data + __n,str,0xfe);
  _ok((uint)(iVar7 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "payload of mp_encode_ext_safe(buf, &sz)");
  hl = lStack_730 + -1;
  pcVar9 = mp_encode_ext_safe(data,&hl,sz._3_1_,str,0xfe);
  _ok((uint)(hl == -1),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(buf, &sz) overflow");
  _ok((uint)(pcVar9 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "mp_encode_ext_safe(buf, &sz) overflow");
  pcVar9 = mp_encode_ext_safe(data,(ptrdiff_t *)0x0,sz._3_1_,str,0xfe);
  _ok((uint)((long)pcVar9 - (long)data == lStack_730),"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "len of mp_encode_ext_safe(buf, NULL)");
  iVar7 = memcmp(data,(void *)((long)&d + 3),__n);
  _ok((uint)(iVar7 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "head of mp_encode_ext_safe(buf, NULL)");
  iVar7 = memcmp(data + __n,str,0xfe);
  _ok((uint)(iVar7 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "payload of mp_encode_ext_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_exts");
  iVar7 = check_plan();
  return iVar7;
}

Assistant:

static int
test_exts(void)
{
	plan(25*9 + 11);
	header();

	test_ext(0x01);
	test_ext(0x02);
	test_ext(0x03);
	test_ext(0x04);
	test_ext(0x05);
	test_ext(0x06);
	test_ext(0x07);
	test_ext(0x08);
	test_ext(0x09);
	test_ext(0x0a);
	test_ext(0x0b);
	test_ext(0x0c);
	test_ext(0x0d);
	test_ext(0x0e);
	test_ext(0x0f);
	test_ext(0x10);

	test_ext(0x11);
	test_ext(0xfe);
	test_ext(0xff);

	test_ext(0x0100);
	test_ext(0x0101);
	test_ext(0xfffe);
	test_ext(0xffff);

	test_ext(0x00010000);
	test_ext(0x00010001);

	test_ext_safe(0xfe);

	footer();
	return check_plan();
}